

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O1

void __thiscall leveldb::Harness::Init(Harness *this,TestArgs *args)

{
  _Rb_tree_header *p_Var1;
  Comparator *pCVar2;
  MemTableConstructor *this_00;
  long lVar3;
  Options *pOVar4;
  Harness *pHVar5;
  byte bVar6;
  Options OStack_78;
  
  bVar6 = 0;
  if (this->constructor_ != (Constructor *)0x0) {
    (*this->constructor_->_vptr_Constructor[1])();
  }
  this->constructor_ = (Constructor *)0x0;
  Options::Options(&OStack_78);
  pOVar4 = &OStack_78;
  pHVar5 = this;
  for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pHVar5->options_).comparator = pOVar4->comparator;
    pOVar4 = (Options *)((long)pOVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    pHVar5 = (Harness *)((long)pHVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  (this->options_).block_restart_interval = args->restart_interval;
  (this->options_).block_size = 0x100;
  if (args->reverse_compare == true) {
    (this->options_).comparator = (Comparator *)&reverse_key_comparator;
  }
  switch(args->type) {
  case TABLE_TEST:
    this_00 = (MemTableConstructor *)operator_new(0x48);
    (this_00->super_Constructor).data_._M_t._M_impl.
    super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>._M_key_compare.cmp =
         (this->options_).comparator;
    p_Var1 = &(this_00->super_Constructor).data_._M_t._M_impl.super__Rb_tree_header;
    (this_00->super_Constructor).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _S_red;
    (this_00->super_Constructor).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (this_00->super_Constructor).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (this_00->super_Constructor).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (this_00->super_Constructor).data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (this_00->super_Constructor)._vptr_Constructor = (_func_int **)&PTR__TableConstructor_0013edd0;
    (this_00->internal_comparator_).super_Comparator._vptr_Comparator = (_func_int **)0x0;
    (this_00->internal_comparator_).user_comparator_ = (Comparator *)0x0;
    break;
  case BLOCK_TEST:
    this_00 = (MemTableConstructor *)operator_new(0x68);
    pCVar2 = (this->options_).comparator;
    (this_00->super_Constructor).data_._M_t._M_impl.
    super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>._M_key_compare.cmp =
         pCVar2;
    p_Var1 = &(this_00->super_Constructor).data_._M_t._M_impl.super__Rb_tree_header;
    (this_00->super_Constructor).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _S_red;
    (this_00->super_Constructor).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (this_00->super_Constructor).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (this_00->super_Constructor).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (this_00->super_Constructor).data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (this_00->super_Constructor)._vptr_Constructor = (_func_int **)&PTR__BlockConstructor_0013ec18;
    (this_00->internal_comparator_).super_Comparator._vptr_Comparator = (_func_int **)pCVar2;
    (this_00->internal_comparator_).user_comparator_ = (Comparator *)(this_00 + 1);
    this_00->memtable_ = (MemTable *)0x0;
    *(undefined1 *)&this_00[1].super_Constructor._vptr_Constructor = 0;
    *(undefined8 *)&this_00[1].super_Constructor.data_._M_t._M_impl.super__Rb_tree_header._M_header
         = 0;
    break;
  case MEMTABLE_TEST:
    this_00 = (MemTableConstructor *)operator_new(0x50);
    MemTableConstructor::MemTableConstructor(this_00,(this->options_).comparator);
    break;
  case DB_TEST:
    this_00 = (MemTableConstructor *)operator_new(0x48);
    DBConstructor::DBConstructor((DBConstructor *)this_00,(this->options_).comparator);
    break;
  default:
    goto switchD_0010b4dc_default;
  }
  this->constructor_ = &this_00->super_Constructor;
switchD_0010b4dc_default:
  return;
}

Assistant:

void Init(const TestArgs& args) {
    delete constructor_;
    constructor_ = nullptr;
    options_ = Options();

    options_.block_restart_interval = args.restart_interval;
    // Use shorter block size for tests to exercise block boundary
    // conditions more.
    options_.block_size = 256;
    if (args.reverse_compare) {
      options_.comparator = &reverse_key_comparator;
    }
    switch (args.type) {
      case TABLE_TEST:
        constructor_ = new TableConstructor(options_.comparator);
        break;
      case BLOCK_TEST:
        constructor_ = new BlockConstructor(options_.comparator);
        break;
      case MEMTABLE_TEST:
        constructor_ = new MemTableConstructor(options_.comparator);
        break;
      case DB_TEST:
        constructor_ = new DBConstructor(options_.comparator);
        break;
    }
  }